

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O3

Key icu_63::unisets::chooseFrom(UnicodeString *str,Key key1,Key key2)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  UnicodeString UStack_58;
  
  pUVar2 = get(key1);
  UVar1 = UnicodeSet::contains(pUVar2,str);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString(&UStack_58,str);
    pUVar2 = get(key2);
    UVar1 = UnicodeSet::contains(pUVar2,&UStack_58);
    key1 = -(uint)(UVar1 == '\0') | key2;
    UnicodeString::~UnicodeString(&UStack_58);
  }
  return key1;
}

Assistant:

Key unisets::chooseFrom(UnicodeString str, Key key1, Key key2) {
    return get(key1)->contains(str) ? key1 : chooseFrom(str, key2);
}